

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall aalcalc::debug(aalcalc *this,string *subfolder)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  undefined8 extraout_RAX;
  bool bVar5;
  string s;
  string path;
  string local_b8;
  undefined1 local_98 [40];
  undefined1 *local_70;
  undefined1 local_60 [16];
  _Base_ptr local_50 [4];
  
  local_98._32_8_ = this;
  loadoccurrence(this);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 "work/",subfolder);
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_98);
  iVar2 = std::__cxx11::string::compare((char *)&local_b8);
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (iVar2 != 0) {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_98._0_8_,(char *)(local_98._0_8_ + local_98._8_8_));
    std::__cxx11::string::append((char *)&local_b8);
    std::__cxx11::string::operator=((string *)local_98,(string *)&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
  }
  __dirp = opendir((char *)local_98._0_8_);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar3 = readdir(__dirp);
      if (pdVar3 == (dirent *)0x0) break;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      sVar4 = strlen(pdVar3->d_name);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,pdVar3->d_name,pdVar3->d_name + sVar4);
      if (local_b8._M_string_length < 5) {
        bVar5 = false;
      }
      else {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&local_b8);
        iVar2 = std::__cxx11::string::compare((char *)local_50);
        bVar5 = iVar2 == 0;
        if (local_50[0] != (_Base_ptr)(local_50 + 2)) {
          operator_delete(local_50[0]);
        }
      }
      if (bVar5) {
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_70,local_98._0_8_,(char *)(local_98._0_8_ + local_98._8_8_));
        std::__cxx11::string::append((char *)&local_70);
        std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_70);
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        debug_process_summaryfile((aalcalc *)local_98._32_8_,&local_b8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p);
      }
    }
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_);
    }
    return;
  }
  debug((aalcalc *)local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void aalcalc::debug(const std::string &subfolder)
{
	loadoccurrence();
	std::string path = "work/" + subfolder;
	if (path.substr(path.length() - 1, 1) != "/") {
		path = path + "/";
	}

	DIR *dir;
	struct dirent *ent;
	if ((dir = opendir(path.c_str())) != NULL) {
		while ((ent = readdir(dir)) != NULL) {
			std::string s = ent->d_name;
			if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
				s = path + ent->d_name;
				debug_process_summaryfile(s);
			}
		}
	}
	else {
		fprintf(stderr, "FATAL: Unable to open directory %s\n", path.c_str());
		exit(-1);
	}
}